

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_trace.c
# Opt level: O1

void trace_end_(long *proc)

{
  ulong uVar1;
  FILE *__stream;
  unsigned_long uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  char fname [10];
  char local_3a [10];
  
  sprintf(local_3a,"%03d",(ulong)(uint)*proc);
  __stream = fopen(local_3a,"w");
  uVar2 = MAX_EVENTS;
  if (current < MAX_EVENTS) {
    uVar2 = current;
  }
  if (uVar2 != 0) {
    lVar5 = 0;
    uVar3 = 0;
    do {
      fprintf(__stream,"%d ",(ulong)(uint)*proc);
      if (uVar3 * 6 < uVar3 * 6 + 6) {
        lVar4 = 0;
        do {
          fprintf(__stream,"%d ",(ulong)*(uint *)((long)indlog + lVar4 * 8 + lVar5));
          lVar4 = lVar4 + 1;
        } while (lVar4 != 6);
      }
      uVar1 = uVar3 + 1;
      fprintf(__stream,"%ld %ld\n",tlog[uVar3 * 2],tlog[uVar3 * 2 + 1]);
      uVar2 = MAX_EVENTS;
      if (current < MAX_EVENTS) {
        uVar2 = current;
      }
      lVar5 = lVar5 + 0x30;
      uVar3 = uVar1;
    } while (uVar1 < uVar2);
  }
  MA_pop_stack(gahandle);
  MA_pop_stack(ihandle);
  MA_pop_stack(thandle);
  fclose(__stream);
  return;
}

Assistant:

void trace_end_(long *proc)
{
    FILE *fout;
    char fname[10];
    unsigned long i,k;
    
    sprintf(fname,"%03d",(int)*proc);
    fout=fopen(fname,"w");
    
    for(i=0;i<min(current,MAX_EVENTS);i++){
        fprintf(fout,"%d ",(int)*proc);
        for(k=i*6;k<6*(i+1);k++)fprintf(fout,"%d ",(int)indlog[k]);
        fprintf(fout,"%ld %ld\n",(unsigned long)tlog[i*2],
                (unsigned long)tlog[i*2+1]);
    }

    MA_pop_stack(gahandle);
    MA_pop_stack(ihandle);
    MA_pop_stack(thandle);
    
    fclose(fout);
}